

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

mempool * mempool_iterator_next(mempool_iterator *it)

{
  uint uVar1;
  mempool *pmVar2;
  
  uVar1 = it->small_iterator;
  if (uVar1 < it->alloc->small_mempool_cache_size) {
    it->small_iterator = uVar1 + 1;
    pmVar2 = &it->alloc->small_mempool_cache[uVar1].pool;
  }
  else {
    pmVar2 = (mempool *)0x0;
  }
  return pmVar2;
}

Assistant:

struct mempool *
mempool_iterator_next(struct mempool_iterator *it)
{
	struct small_mempool *small_mempool = NULL;
	if (it->small_iterator < it->alloc->small_mempool_cache_size)
		small_mempool =
			&it->alloc->small_mempool_cache[(it->small_iterator)++];
	if (small_mempool)
		return &(small_mempool->pool);

	return NULL;
}